

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O3

void aom_int_pro_row_avx2
               (int16_t *hbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [62];
  undefined1 auVar4 [60];
  undefined1 auVar5 [58];
  undefined1 auVar6 [62];
  undefined1 auVar7 [60];
  undefined1 auVar8 [58];
  undefined1 auVar9 [64];
  undefined1 auVar10 [61];
  undefined1 auVar11 [59];
  undefined1 auVar12 [57];
  undefined1 auVar13 [61];
  undefined1 auVar14 [59];
  undefined1 auVar15 [57];
  undefined1 *puVar16;
  ulong uVar17;
  undefined1 (*pauVar18) [16];
  undefined1 (*pauVar19) [32];
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 in_ZMM0 [64];
  undefined4 uVar22;
  undefined1 auVar28 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar40 [64];
  short sVar41;
  undefined1 auVar48 [32];
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  undefined1 auVar49 [64];
  undefined1 in_ZMM5 [64];
  undefined6 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [14];
  undefined1 auVar27 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined4 uVar42;
  undefined6 uVar43;
  undefined8 uVar44;
  undefined1 auVar45 [12];
  undefined1 auVar46 [14];
  undefined1 auVar47 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  
  if ((width & 0x1fU) == 0) {
    if (0 < width) {
      uVar17 = 0;
      do {
        pauVar19 = (undefined1 (*) [32])(ref + uVar17);
        auVar29 = ZEXT1664((undefined1  [16])0x0);
        iVar20 = 0;
        auVar40 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar21 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar2 = vpunpcklbw_avx2(*pauVar19,auVar21);
          auVar2 = vpaddw_avx2(auVar40._0_32_,auVar2);
          auVar1 = vpunpckhbw_avx2(*pauVar19,auVar21);
          auVar1 = vpaddw_avx2(auVar29._0_32_,auVar1);
          puVar16 = *pauVar19;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + (long)ref_stride * 2);
          auVar48 = vpunpcklbw_avx2(*(undefined1 (*) [32])(puVar16 + ref_stride),auVar21);
          auVar2 = vpaddw_avx2(auVar2,auVar48);
          auVar40 = ZEXT3264(auVar2);
          auVar48 = vpunpckhbw_avx2(*(undefined1 (*) [32])(puVar16 + ref_stride),auVar21);
          auVar1 = vpaddw_avx2(auVar1,auVar48);
          auVar29 = ZEXT3264(auVar1);
          iVar20 = iVar20 + 2;
        } while (iVar20 < height);
        auVar2 = vpsraw_avx2(auVar2,ZEXT416((uint)norm_factor));
        auVar1 = vpsraw_avx2(auVar1,ZEXT416((uint)norm_factor));
        auVar48._0_16_ = ZEXT116(0) * auVar1._0_16_ + ZEXT116(1) * auVar2._0_16_;
        auVar48._16_16_ = ZEXT116(0) * auVar2._16_16_ + ZEXT116(1) * auVar1._0_16_;
        *(undefined1 (*) [32])(hbuf + uVar17) = auVar48;
        auVar2 = vperm2i128_avx2(auVar2,auVar1,0x31);
        *(undefined1 (*) [32])(hbuf + uVar17 + 0x10) = auVar2;
        uVar17 = uVar17 + 0x20;
      } while (uVar17 < (uint)width);
    }
  }
  else if ((width & 0xfU) == 0) {
    if (0 < width) {
      uVar17 = 0;
      auVar29 = ZEXT4864(in_ZMM0._16_48_) << 0x80;
      do {
        pauVar18 = (undefined1 (*) [16])(ref + uVar17);
        auVar40 = ZEXT4864(in_ZMM2._16_48_) << 0x80;
        iVar20 = 0;
        auVar31 = ZEXT4864(in_ZMM3._16_48_) << 0x80;
        do {
          auVar27 = *pauVar18;
          auVar56._16_48_ = in_ZMM5._16_48_;
          auVar56._0_15_ = auVar27._0_15_;
          auVar56[0xf] = 0;
          auVar55._15_49_ = auVar56._15_49_;
          auVar55._0_14_ = auVar27._0_14_;
          auVar55[0xe] = auVar27[7];
          auVar54._14_50_ = auVar55._14_50_;
          auVar54._0_13_ = auVar27._0_13_;
          auVar54[0xd] = 0;
          auVar53._13_51_ = auVar54._13_51_;
          auVar53._0_12_ = auVar27._0_12_;
          auVar53[0xc] = auVar27[6];
          auVar52._12_52_ = auVar53._12_52_;
          auVar52._0_11_ = auVar27._0_11_;
          auVar52[0xb] = 0;
          auVar51._11_53_ = auVar52._11_53_;
          auVar51._0_10_ = auVar27._0_10_;
          auVar51[10] = auVar27[5];
          auVar50._10_54_ = auVar51._10_54_;
          auVar50._0_9_ = auVar27._0_9_;
          auVar50[9] = 0;
          auVar49._9_55_ = auVar50._9_55_;
          auVar49._0_8_ = auVar27._0_8_;
          auVar49[8] = auVar27[4];
          auVar12[0x38] = 0;
          auVar12._0_56_ = auVar49._8_56_;
          auVar5._1_57_ = auVar12 << 8;
          auVar5[0] = auVar27[3];
          auVar11[0x3a] = 0;
          auVar11._0_58_ = auVar5;
          auVar4._1_59_ = auVar11 << 8;
          auVar4[0] = auVar27[2];
          auVar10[0x3c] = 0;
          auVar10._0_60_ = auVar4;
          auVar3._1_61_ = auVar10 << 8;
          auVar3[0] = auVar27[1];
          sVar57 = auVar5._0_2_ + auVar31._6_2_;
          sVar58 = auVar49._8_2_ + auVar31._8_2_;
          auVar9._2_2_ = sVar58;
          auVar9._0_2_ = sVar57;
          sVar59 = auVar51._10_2_ + auVar31._10_2_;
          auVar9._4_2_ = sVar59;
          sVar60 = auVar53._12_2_ + auVar31._12_2_;
          auVar9._6_2_ = sVar60;
          sVar61 = auVar55._14_2_ + auVar31._14_2_;
          auVar9._8_2_ = sVar61;
          auVar9._10_48_ = auVar56._16_48_;
          auVar9._58_6_ = 0;
          in_ZMM5 = auVar9 << 0x30;
          sVar41 = CONCAT11(auVar29[8],auVar27[8]);
          uVar42 = CONCAT13(auVar29[9],CONCAT12(auVar27[9],sVar41));
          uVar43 = CONCAT15(auVar29[10],CONCAT14(auVar27[10],uVar42));
          uVar44 = CONCAT17(auVar29[0xb],CONCAT16(auVar27[0xb],uVar43));
          auVar45._0_10_ = CONCAT19(auVar29[0xc],CONCAT18(auVar27[0xc],uVar44));
          auVar45[10] = auVar27[0xd];
          auVar45[0xb] = auVar29[0xd];
          auVar46[0xc] = auVar27[0xe];
          auVar46._0_12_ = auVar45;
          auVar46[0xd] = auVar29[0xe];
          auVar47[0xe] = auVar27[0xf];
          auVar47._0_14_ = auVar46;
          auVar47[0xf] = auVar29[0xf];
          auVar28 = *(undefined1 (*) [16])(*pauVar18 + ref_stride);
          pauVar18 = (undefined1 (*) [16])(*pauVar18 + (long)ref_stride * 2);
          auVar39._16_48_ = auVar31._16_48_;
          auVar39._0_15_ = auVar28._0_15_;
          auVar39[0xf] = 0;
          auVar38._15_49_ = auVar39._15_49_;
          auVar38._0_14_ = auVar28._0_14_;
          auVar38[0xe] = auVar28[7];
          auVar37._14_50_ = auVar38._14_50_;
          auVar37._0_13_ = auVar28._0_13_;
          auVar37[0xd] = 0;
          auVar36._13_51_ = auVar37._13_51_;
          auVar36._0_12_ = auVar28._0_12_;
          auVar36[0xc] = auVar28[6];
          auVar35._12_52_ = auVar36._12_52_;
          auVar35._0_11_ = auVar28._0_11_;
          auVar35[0xb] = 0;
          auVar34._11_53_ = auVar35._11_53_;
          auVar34._0_10_ = auVar28._0_10_;
          auVar34[10] = auVar28[5];
          auVar33._10_54_ = auVar34._10_54_;
          auVar33._0_9_ = auVar28._0_9_;
          auVar33[9] = 0;
          auVar32._9_55_ = auVar33._9_55_;
          auVar32._0_8_ = auVar28._0_8_;
          auVar32[8] = auVar28[4];
          auVar15[0x38] = 0;
          auVar15._0_56_ = auVar32._8_56_;
          auVar8._1_57_ = auVar15 << 8;
          auVar8[0] = auVar28[3];
          auVar14[0x3a] = 0;
          auVar14._0_58_ = auVar8;
          auVar7._1_59_ = auVar14 << 8;
          auVar7[0] = auVar28[2];
          auVar13[0x3c] = 0;
          auVar13._0_60_ = auVar7;
          auVar6._1_61_ = auVar13 << 8;
          auVar6[0] = auVar28[1];
          auVar30._0_2_ = (ushort)auVar28[0] + (ushort)auVar27[0] + auVar31._0_2_;
          auVar30._2_2_ = auVar6._0_2_ + auVar3._0_2_ + auVar31._2_2_;
          auVar30._4_2_ = auVar7._0_2_ + auVar4._0_2_ + auVar31._4_2_;
          auVar30._6_2_ = auVar8._0_2_ + sVar57;
          auVar30._8_2_ = auVar32._8_2_ + sVar58;
          auVar30._10_2_ = auVar34._10_2_ + sVar59;
          auVar30._12_2_ = auVar36._12_2_ + sVar60;
          auVar30._14_2_ = auVar38._14_2_ + sVar61;
          auVar31._16_48_ = auVar39._16_48_;
          auVar31._0_16_ = auVar30;
          sVar57 = CONCAT11(auVar29[8],auVar28[8]);
          uVar22 = CONCAT13(auVar29[9],CONCAT12(auVar28[9],sVar57));
          uVar23 = CONCAT15(auVar29[10],CONCAT14(auVar28[10],uVar22));
          uVar24 = CONCAT17(auVar29[0xb],CONCAT16(auVar28[0xb],uVar23));
          auVar25._0_10_ = CONCAT19(auVar29[0xc],CONCAT18(auVar28[0xc],uVar24));
          auVar25[10] = auVar28[0xd];
          auVar25[0xb] = auVar29[0xd];
          auVar26[0xc] = auVar28[0xe];
          auVar26._0_12_ = auVar25;
          auVar26[0xd] = auVar29[0xe];
          auVar27[0xe] = auVar28[0xf];
          auVar27._0_14_ = auVar26;
          auVar27[0xf] = auVar29[0xf];
          auVar28._0_2_ = sVar57 + sVar41 + auVar40._0_2_;
          auVar28._2_2_ =
               (short)((uint)uVar22 >> 0x10) + (short)((uint)uVar42 >> 0x10) + auVar40._2_2_;
          auVar28._4_2_ =
               (short)((uint6)uVar23 >> 0x20) + (short)((uint6)uVar43 >> 0x20) + auVar40._4_2_;
          auVar28._6_2_ =
               (short)((ulong)uVar24 >> 0x30) + (short)((ulong)uVar44 >> 0x30) + auVar40._6_2_;
          auVar28._8_2_ =
               (short)((unkuint10)auVar25._0_10_ >> 0x40) +
               (short)((unkuint10)auVar45._0_10_ >> 0x40) + auVar40._8_2_;
          auVar28._10_2_ = auVar25._10_2_ + auVar45._10_2_ + auVar40._10_2_;
          auVar28._12_2_ = auVar26._12_2_ + auVar46._12_2_ + auVar40._12_2_;
          auVar28._14_2_ = auVar27._14_2_ + auVar47._14_2_ + auVar40._14_2_;
          auVar40._0_16_ = auVar28;
          iVar20 = iVar20 + 2;
        } while (iVar20 < height);
        in_ZMM3._0_16_ = psraw(auVar30,ZEXT416((uint)norm_factor));
        in_ZMM3._16_48_ = auVar39._16_48_;
        in_ZMM2._0_16_ = psraw(auVar28,ZEXT416((uint)norm_factor));
        in_ZMM2._16_48_ = auVar40._16_48_;
        *(undefined1 (*) [16])(hbuf + uVar17) = in_ZMM3._0_16_;
        *(undefined1 (*) [16])(hbuf + uVar17 + 8) = in_ZMM2._0_16_;
        uVar17 = uVar17 + 0x10;
      } while (uVar17 < (uint)width);
    }
    return;
  }
  return;
}

Assistant:

void aom_int_pro_row_avx2(int16_t *hbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width and height to be multiple of 16 and 2
  // respectively. For any odd width or height, SIMD support needs to be added.
  assert(width % 16 == 0 && height % 2 == 0);

  if (width % 32 == 0) {
    const __m256i zero = _mm256_setzero_si256();
    for (int wd = 0; wd < width; wd += 32) {
      const uint8_t *ref_tmp = ref + wd;
      int16_t *hbuf_tmp = hbuf + wd;
      __m256i s0 = zero;
      __m256i s1 = zero;
      int idx = 0;
      do {
        __m256i src_line = _mm256_loadu_si256((const __m256i *)ref_tmp);
        __m256i t0 = _mm256_unpacklo_epi8(src_line, zero);
        __m256i t1 = _mm256_unpackhi_epi8(src_line, zero);
        s0 = _mm256_add_epi16(s0, t0);
        s1 = _mm256_add_epi16(s1, t1);
        ref_tmp += ref_stride;

        src_line = _mm256_loadu_si256((const __m256i *)ref_tmp);
        t0 = _mm256_unpacklo_epi8(src_line, zero);
        t1 = _mm256_unpackhi_epi8(src_line, zero);
        s0 = _mm256_add_epi16(s0, t0);
        s1 = _mm256_add_epi16(s1, t1);
        ref_tmp += ref_stride;
        idx += 2;
      } while (idx < height);
      s0 = _mm256_srai_epi16(s0, norm_factor);
      s1 = _mm256_srai_epi16(s1, norm_factor);
      _mm_storeu_si128((__m128i *)(hbuf_tmp), _mm256_castsi256_si128(s0));
      _mm_storeu_si128((__m128i *)(hbuf_tmp + 8), _mm256_castsi256_si128(s1));
      _mm_storeu_si128((__m128i *)(hbuf_tmp + 16),
                       _mm256_extractf128_si256(s0, 1));
      _mm_storeu_si128((__m128i *)(hbuf_tmp + 24),
                       _mm256_extractf128_si256(s1, 1));
    }
  } else if (width % 16 == 0) {
    aom_int_pro_row_sse2(hbuf, ref, ref_stride, width, height, norm_factor);
  }
}